

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_rtext.c
# Opt level: O3

int rtext_findatomfor(_rtext *x,int xpos,int ypos)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int indx;
  int h;
  int w;
  uint local_1c;
  int local_18;
  int local_14;
  
  local_18 = ypos;
  local_14 = xpos;
  rtext_senditup(x,2,&local_14,&local_18,(int *)&local_1c);
  if ((int)local_1c < 0) {
    iVar3 = -1;
  }
  else {
    lVar4 = 0;
    bVar2 = false;
    iVar3 = 0;
    do {
      bVar1 = x->x_buf[lVar4];
      if (bVar1 < 0x2c) {
        if ((bVar1 == 10) || (bVar1 == 0x20)) goto LAB_00153725;
LAB_00153731:
        iVar3 = iVar3 + (uint)!bVar2;
        bVar2 = true;
      }
      else {
        if ((bVar1 != 0x3b) && (bVar1 != 0x2c)) goto LAB_00153731;
        iVar3 = iVar3 + 1;
LAB_00153725:
        bVar2 = false;
      }
      lVar4 = lVar4 + 1;
    } while ((ulong)local_1c + 1 != lVar4);
    iVar3 = iVar3 + -1;
  }
  return iVar3;
}

Assistant:

int rtext_findatomfor(t_rtext *x, int xpos, int ypos)
{
    int w = xpos, h = ypos, indx, natom = 0, i, gotone = 0;
        /* get byte index of character clicked on */
    rtext_senditup(x, SEND_UPDATE, &w, &h, &indx);
        /* search through for whitespace before that index */
    for (i = 0; i <= indx; i++)
    {
        if (x->x_buf[i] == ';' || x->x_buf[i] == ',')
            natom++, gotone = 0;
        else if (x->x_buf[i] == ' ' || x->x_buf[i] == '\n')
            gotone = 0;
        else
        {
            if (!gotone)
                natom++;
            gotone = 1;
        }
    }
    return (natom-1);
}